

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O1

void __thiscall verilogAST::Attribute::Attribute(Attribute *this,Attribute *rhs)

{
  pointer pcVar1;
  anon_class_1_0_00000001 local_19;
  
  (this->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__001765b8;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST.hpp:164:13)_&&,_const_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(rhs->value).
              super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>_>
              .
              super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
              .
              super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
              .
              super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
              .
              super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
              .
              super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Attribute>_>
      + 8)]._M_data)(&this->value,&local_19,&rhs->value);
  (this->attr)._M_dataplus._M_p = (pointer)&(this->attr).field_2;
  pcVar1 = (rhs->attr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->attr,pcVar1,pcVar1 + (rhs->attr)._M_string_length);
  return;
}

Assistant:

Attribute(const Attribute& rhs)
      : value(std::visit(
            [](auto&& val) -> std::variant<std::unique_ptr<Identifier>,
                                           std::unique_ptr<Attribute>> {
              return val->clone();
            },
            rhs.value)),
        attr(rhs.attr){}